

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::ProfileModulus<true>
          (InterpreterStackFrame *this,Var aLeft,Var aRight,ScriptContext *scriptContext,
          ProfileId profileId)

{
  bool bVar1;
  uint uVar2;
  int32 val;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar3;
  Var pvVar4;
  int nRight;
  int nLeft;
  FunctionBody *body;
  ProfileId profileId_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  InterpreterStackFrame *this_local;
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(aLeft);
    val = TaggedInt::ToInt32(aRight);
    if ((0 < (int)uVar2) && (bVar1 = ::Math::IsPow2(val), bVar1)) {
      pDVar3 = FunctionBody::GetDynamicProfileInfo(this_00);
      DynamicProfileInfo::RecordModulusOpType(pDVar3,this_00,profileId,true);
      pvVar4 = TaggedInt::ToVarUnchecked(uVar2 & val - 1U);
      return pvVar4;
    }
  }
  pDVar3 = FunctionBody::GetDynamicProfileInfo(this_00);
  DynamicProfileInfo::RecordModulusOpType(pDVar3,this_00,profileId,false);
  pvVar4 = JavascriptMath::Modulus(aLeft,aRight,scriptContext);
  return pvVar4;
}

Assistant:

Var InterpreterStackFrame::ProfileModulus(Var aLeft, Var aRight, ScriptContext* scriptContext, ProfileId profileId)
    {
        // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
        if (doProfile)
        {
            Js::FunctionBody* body = this->function->GetFunctionBody();
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                int nLeft = TaggedInt::ToInt32(aLeft);
                int nRight = TaggedInt::ToInt32(aRight);

                // nLeft is positive and nRight is +2^i
                // Fast path for Power of 2 divisor
                if (nLeft > 0 && ::Math::IsPow2(nRight))
                {
                    body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ true);
                    return TaggedInt::ToVarUnchecked(nLeft & (nRight - 1));
                }
            }
            body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ false);
        }

        return JavascriptMath::Modulus(aLeft, aRight, scriptContext);
    }